

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorBuilder::CheckExtensionDeclaration
          (DescriptorBuilder *this,FieldDescriptor *field,FieldDescriptorProto *proto,
          string_view declared_full_name,string_view declared_type_name,bool is_repeated)

{
  char *pcVar1;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  int iVar2;
  undefined8 extraout_RAX;
  size_t __n;
  bool bVar3;
  _Alloc_hider _Var4;
  char *pcVar5;
  size_type __rlen;
  string_view element_name;
  string_view element_name_00;
  string actual_full_name;
  undefined1 local_f1;
  DescriptorBuilder *local_f0;
  FieldDescriptorProto *local_e8;
  string local_e0;
  VoidPtr local_c0;
  code *pcStack_b8;
  VoidPtr local_b0;
  code *pcStack_a8;
  size_t local_a0;
  char *local_98;
  FieldDescriptor *local_90;
  size_t *local_88;
  string *local_80;
  AlphaNum local_60;
  
  pcVar5 = declared_full_name._M_str;
  __n = declared_full_name._M_len;
  local_f1 = is_repeated;
  local_a0 = __n;
  local_98 = pcVar5;
  if (declared_type_name._M_len != 0) {
    CheckExtensionDeclarationFieldType(this,field,proto,declared_type_name);
  }
  if (__n != 0) {
    local_90 = (FieldDescriptor *)0x1;
    local_88 = (size_t *)0x30f3ec;
    pcVar1 = (field->all_names_).payload_;
    local_60.piece_._M_len = (size_t)*(ushort *)(pcVar1 + 2);
    local_60.piece_._M_str = pcVar1 + ~local_60.piece_._M_len;
    local_f0 = this;
    local_e8 = proto;
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_e0,(lts_20250127 *)&local_90,&local_60,(AlphaNum *)local_60.piece_._M_str);
    _Var4._M_p = local_e0._M_dataplus._M_p;
    if ((local_e0._M_string_length != __n) ||
       (iVar2 = bcmp(pcVar5,local_e0._M_dataplus._M_p,__n), iVar2 != 0)) {
      pcVar5 = (field->all_names_).payload_;
      element_name._M_len = (ulong)*(ushort *)(pcVar5 + 2);
      element_name._M_str = pcVar5 + ~element_name._M_len;
      local_88 = &local_a0;
      pcStack_a8 = absl::lts_20250127::functional_internal::
                   InvokeObject<google::protobuf::DescriptorBuilder::CheckExtensionDeclaration(google::protobuf::FieldDescriptor_const&,google::protobuf::FieldDescriptorProto_const&,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,bool)::__0,std::__cxx11::string>
      ;
      local_b0.obj = &local_90;
      make_error.invoker_ =
           absl::lts_20250127::functional_internal::
           InvokeObject<google::protobuf::DescriptorBuilder::CheckExtensionDeclaration(google::protobuf::FieldDescriptor_const&,google::protobuf::FieldDescriptorProto_const&,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,bool)::__0,std::__cxx11::string>
      ;
      make_error.ptr_.obj = local_b0.obj;
      local_90 = field;
      local_80 = &local_e0;
      AddError(local_f0,element_name,&local_e8->super_Message,EXTENDEE,make_error);
      _Var4._M_p = local_e0._M_dataplus._M_p;
    }
    proto = local_e8;
    this = local_f0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var4._M_p != &local_e0.field_2) {
      operator_delete(_Var4._M_p,local_e0.field_2._M_allocated_capacity + 1);
      proto = local_e8;
      this = local_f0;
    }
  }
  bVar3 = (bool)((field->field_0x1 & 0x20) >> 5);
  if (0xbf < (byte)field->field_0x1 != bVar3) {
    CheckExtensionDeclaration();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    _Unwind_Resume(extraout_RAX);
  }
  if (bVar3 != is_repeated) {
    pcVar5 = (field->all_names_).payload_;
    element_name_00._M_len = (ulong)*(ushort *)(pcVar5 + 2);
    element_name_00._M_str = pcVar5 + ~element_name_00._M_len;
    local_c0.obj = &local_90;
    local_88 = (size_t *)&local_f1;
    pcStack_b8 = absl::lts_20250127::functional_internal::
                 InvokeObject<google::protobuf::DescriptorBuilder::CheckExtensionDeclaration(google::protobuf::FieldDescriptor_const&,google::protobuf::FieldDescriptorProto_const&,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,bool)::__1,std::__cxx11::string>
    ;
    make_error_00.invoker_ =
         absl::lts_20250127::functional_internal::
         InvokeObject<google::protobuf::DescriptorBuilder::CheckExtensionDeclaration(google::protobuf::FieldDescriptor_const&,google::protobuf::FieldDescriptorProto_const&,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,bool)::__1,std::__cxx11::string>
    ;
    make_error_00.ptr_.obj = local_c0.obj;
    local_90 = field;
    AddError(this,element_name_00,&proto->super_Message,EXTENDEE,make_error_00);
  }
  return;
}

Assistant:

void DescriptorBuilder::CheckExtensionDeclaration(
    const FieldDescriptor& field, const FieldDescriptorProto& proto,
    absl::string_view declared_full_name, absl::string_view declared_type_name,
    bool is_repeated) {
  if (!declared_type_name.empty()) {
    CheckExtensionDeclarationFieldType(field, proto, declared_type_name);
  }
  if (!declared_full_name.empty()) {
    std::string actual_full_name = absl::StrCat(".", field.full_name());
    if (declared_full_name != actual_full_name) {
      AddError(field.full_name(), proto,
               DescriptorPool::ErrorCollector::EXTENDEE, [&] {
                 return absl::Substitute(
                     "\"$0\" extension field $1 is expected to have field name "
                     "\"$2\", not \"$3\".",
                     field.containing_type()->full_name(), field.number(),
                     declared_full_name, actual_full_name);
               });
    }
  }

  if (is_repeated != field.is_repeated()) {
    AddError(field.full_name(), proto, DescriptorPool::ErrorCollector::EXTENDEE,
             [&] {
               return absl::Substitute(
                   "\"$0\" extension field $1 is expected to be $2.",
                   field.containing_type()->full_name(), field.number(),
                   is_repeated ? "repeated" : "optional");
             });
  }
}